

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.cpp
# Opt level: O0

unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> __thiscall
mg::data::MappedMrg::parse(MappedMrg *this,string *hed,shared_ptr<mg::fs::MappedFile> *backing_data)

{
  ulong uVar1;
  MappedMrg *this_00;
  vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
  local_90;
  shared_ptr<mg::fs::MappedFile> local_78 [2];
  PackedEntryHeader local_58;
  PackedEntryHeader header;
  ssize_t i;
  vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
  entries;
  PackedEntryHeader *raw_entries;
  ssize_t entry_count;
  shared_ptr<mg::fs::MappedFile> *backing_data_local;
  string *hed_local;
  
  uVar1 = std::__cxx11::string::size();
  if ((uVar1 & 7) == 0) {
    uVar1 = std::__cxx11::string::size();
    entries.
    super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)std::__cxx11::string::data();
    std::vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ::vector((vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
              *)&i);
    header.offset = 0;
    header.size_sectors = 0;
    header.size_uncompressed_sectors = 0;
    for (; (long)header < (long)(uVar1 >> 3); header = (PackedEntryHeader)((long)header + 1)) {
      local_58 = entries.
                 super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[(long)header];
      Mrg::PackedEntryHeader::to_host_order(&local_58);
      if (local_58.offset == 0xffffffff) break;
      std::vector<mg::data::Mrg::PackedEntryHeader,std::allocator<mg::data::Mrg::PackedEntryHeader>>
      ::emplace_back<mg::data::Mrg::PackedEntryHeader&>
                ((vector<mg::data::Mrg::PackedEntryHeader,std::allocator<mg::data::Mrg::PackedEntryHeader>>
                  *)&i,&local_58);
    }
    this_00 = (MappedMrg *)operator_new(0x28);
    std::shared_ptr<mg::fs::MappedFile>::shared_ptr(local_78,backing_data);
    std::vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ::vector(&local_90,
             (vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
              *)&i);
    MappedMrg(this_00,local_78,&local_90);
    std::unique_ptr<mg::data::MappedMrg,std::default_delete<mg::data::MappedMrg>>::
    unique_ptr<std::default_delete<mg::data::MappedMrg>,void>
              ((unique_ptr<mg::data::MappedMrg,std::default_delete<mg::data::MappedMrg>> *)this,
               this_00);
    std::vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ::~vector(&local_90);
    std::shared_ptr<mg::fs::MappedFile>::~shared_ptr(local_78);
    std::vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ::~vector((vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
               *)&i);
  }
  else {
    fprintf(_stderr,"Wrong size for HED, must be multiple of %lu\n",8);
    std::unique_ptr<mg::data::MappedMrg,std::default_delete<mg::data::MappedMrg>>::
    unique_ptr<std::default_delete<mg::data::MappedMrg>,void>
              ((unique_ptr<mg::data::MappedMrg,std::default_delete<mg::data::MappedMrg>> *)this,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>,_true,_true>
         )(__uniq_ptr_data<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<MappedMrg>
MappedMrg::parse(const std::string &hed,
                 std::shared_ptr<mg::fs::MappedFile> backing_data) {
  // Check header size valid
  if (hed.size() % sizeof(Mrg::PackedEntryHeader) != 0) {
    fprintf(stderr, "Wrong size for HED, must be multiple of %lu\n",
            sizeof(Mrg::PackedEntryHeader));
    return nullptr;
  }

  // Reinterpret header
  const ssize_t entry_count = hed.size() / sizeof(Mrg::PackedEntryHeader);
  const Mrg::PackedEntryHeader *raw_entries =
      reinterpret_cast<const Mrg::PackedEntryHeader *>(hed.data());

  // Load entry table
  std::vector<Mrg::PackedEntryHeader> entries;
  for (ssize_t i = 0; i < entry_count; i++) {
    // Copy current header
    Mrg::PackedEntryHeader header = raw_entries[i];

    // Endian swap to host
    header.to_host_order();

    // Is this EOF?
    if (header.offset == 0xFFFF'FFFF) {
      break;
    }

    // Emplace into list
    entries.emplace_back(header);
  }

  return std::unique_ptr<MappedMrg>(new MappedMrg(backing_data, entries));
}